

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# softmax.cpp
# Opt level: O2

int __thiscall ncnn::Softmax::forward_inplace(Softmax *this,Mat *bottom_top_blob,Option *opt)

{
  uint uVar1;
  int _h;
  size_t sVar2;
  size_t sVar3;
  size_t sVar4;
  int *piVar5;
  bool bVar6;
  int i_1;
  uint uVar7;
  ulong uVar8;
  uint uVar9;
  uint uVar10;
  uint uVar11;
  ulong uVar12;
  int j_1;
  int j_4;
  int iVar13;
  void *pvVar14;
  ulong uVar15;
  int i_5;
  int iVar16;
  int j_8;
  void *pvVar17;
  int j_6;
  ulong uVar18;
  int i;
  int j_7;
  ulong uVar19;
  int i_6;
  void *pvVar20;
  long lVar21;
  int i_7;
  float fVar22;
  float fVar23;
  float fVar24;
  void *local_118;
  Mat local_f8;
  Mat local_a8;
  undefined8 local_58;
  void *local_50;
  long local_48;
  long local_40;
  ulong local_38;
  
  uVar1 = bottom_top_blob->dims;
  sVar2 = bottom_top_blob->elemsize;
  iVar13 = this->axis;
  if (uVar1 == 1) {
    pvVar14 = bottom_top_blob->data;
    uVar8 = 0;
    uVar12 = (ulong)(uint)bottom_top_blob->w;
    if (bottom_top_blob->w < 1) {
      uVar12 = uVar8;
    }
    fVar23 = -3.4028235e+38;
    for (; uVar12 != uVar8; uVar8 = uVar8 + 1) {
      fVar24 = *(float *)((long)pvVar14 + uVar8 * 4);
      if (fVar23 <= fVar24) {
        fVar23 = fVar24;
      }
    }
    fVar24 = 0.0;
    for (uVar8 = 0; uVar12 != uVar8; uVar8 = uVar8 + 1) {
      fVar22 = expf(*(float *)((long)pvVar14 + uVar8 * 4) - fVar23);
      *(float *)((long)pvVar14 + uVar8 * 4) = fVar22;
      fVar24 = fVar24 + fVar22;
    }
    for (uVar8 = 0; uVar12 != uVar8; uVar8 = uVar8 + 1) {
      *(float *)((long)pvVar14 + uVar8 * 4) = *(float *)((long)pvVar14 + uVar8 * 4) * (1.0 / fVar24)
      ;
    }
  }
  iVar13 = (iVar13 >> 0x1f & uVar1) + iVar13;
  local_58 = 0xffffffffffffff9c;
  if ((uVar1 == 2) && (iVar13 == 0)) {
    uVar7 = bottom_top_blob->w;
    uVar10 = bottom_top_blob->h;
    local_f8.cstep = 0;
    local_f8.data = (void *)0x0;
    local_f8.refcount._0_4_ = 0;
    local_f8.refcount._4_4_ = 0;
    local_f8.elemsize._0_4_ = 0;
    local_f8.elemsize._4_4_ = 0;
    local_f8.elempack = 0;
    local_f8.allocator = (Allocator *)0x0;
    local_f8.dims = 0;
    local_f8.w = 0;
    local_f8.h = 0;
    local_f8.d = 0;
    local_f8.c = 0;
    Mat::create(&local_f8,uVar7,sVar2,opt->workspace_allocator);
    if ((local_f8.data != (void *)0x0) && (local_f8.cstep * (long)local_f8.c != 0)) {
      uVar9 = (int)local_f8.cstep * local_f8.c;
      uVar8 = 0;
      uVar12 = (ulong)uVar9;
      if ((int)uVar9 < 1) {
        uVar12 = uVar8;
      }
      for (; (int)uVar12 != (int)uVar8; uVar8 = uVar8 + 1) {
        *(undefined4 *)((long)local_f8.data + uVar8 * 4) = 0xff7fffff;
      }
      iVar16 = bottom_top_blob->w;
      sVar3 = bottom_top_blob->elemsize;
      uVar12 = 0;
      uVar8 = 0;
      if (0 < (int)uVar7) {
        uVar8 = (ulong)uVar7;
      }
      pvVar14 = bottom_top_blob->data;
      uVar19 = (ulong)uVar10;
      if ((int)uVar10 < 1) {
        uVar19 = uVar12;
      }
      for (; uVar12 != uVar19; uVar12 = uVar12 + 1) {
        for (uVar15 = 0; uVar8 != uVar15; uVar15 = uVar15 + 1) {
          fVar23 = *(float *)((long)pvVar14 + uVar15 * 4);
          fVar24 = *(float *)((long)local_f8.data + uVar15 * 4);
          if (fVar23 <= fVar24) {
            fVar23 = fVar24;
          }
          *(float *)((long)local_f8.data + uVar15 * 4) = fVar23;
        }
        pvVar14 = (void *)((long)pvVar14 + (long)iVar16 * sVar3);
      }
      local_a8.cstep = 0;
      local_a8.data = (void *)0x0;
      local_a8.refcount._0_4_ = 0;
      local_a8.refcount._4_4_ = 0;
      local_a8.elemsize._0_4_ = 0;
      local_a8.elemsize._4_4_ = 0;
      local_a8.elempack = 0;
      local_a8.allocator = (Allocator *)0x0;
      local_a8.dims = 0;
      local_a8.w = 0;
      local_a8.h = 0;
      local_a8.d = 0;
      local_a8.c = 0;
      Mat::create(&local_a8,uVar7,sVar2,opt->workspace_allocator);
      pvVar14 = local_a8.data;
      bVar6 = true;
      if ((local_a8.data != (void *)0x0) && (local_a8.cstep * (long)local_a8.c != 0)) {
        uVar7 = (int)local_a8.cstep * local_a8.c;
        uVar15 = 0;
        uVar12 = (ulong)uVar7;
        if ((int)uVar7 < 1) {
          uVar12 = uVar15;
        }
        for (; (int)uVar12 != (int)uVar15; uVar15 = uVar15 + 1) {
          *(undefined4 *)((long)local_a8.data + uVar15 * 4) = 0;
        }
        pvVar20 = bottom_top_blob->data;
        iVar16 = bottom_top_blob->w;
        sVar3 = bottom_top_blob->elemsize;
        for (uVar12 = 0; pvVar17 = local_f8.data, uVar12 != uVar19; uVar12 = uVar12 + 1) {
          for (uVar15 = 0; uVar8 != uVar15; uVar15 = uVar15 + 1) {
            fVar23 = expf(*(float *)((long)pvVar20 + uVar15 * 4) -
                          *(float *)((long)pvVar17 + uVar15 * 4));
            *(float *)((long)pvVar20 + uVar15 * 4) = fVar23;
            *(float *)((long)pvVar14 + uVar15 * 4) = fVar23 + *(float *)((long)pvVar14 + uVar15 * 4)
            ;
          }
          pvVar20 = (void *)((long)pvVar20 + (long)iVar16 * sVar3);
        }
        pvVar20 = bottom_top_blob->data;
        iVar16 = bottom_top_blob->w;
        sVar3 = bottom_top_blob->elemsize;
        for (uVar12 = 0; uVar12 != uVar19; uVar12 = uVar12 + 1) {
          for (uVar15 = 0; uVar8 != uVar15; uVar15 = uVar15 + 1) {
            *(float *)((long)pvVar20 + uVar15 * 4) =
                 *(float *)((long)pvVar20 + uVar15 * 4) / *(float *)((long)pvVar14 + uVar15 * 4);
          }
          pvVar20 = (void *)((long)pvVar20 + (long)iVar16 * sVar3);
        }
        bVar6 = false;
      }
      piVar5 = (int *)CONCAT44(local_a8.refcount._4_4_,local_a8.refcount._0_4_);
      if (piVar5 != (int *)0x0) {
        LOCK();
        *piVar5 = *piVar5 + -1;
        UNLOCK();
        if (*piVar5 == 0) {
          if (local_a8.allocator == (Allocator *)0x0) {
            free(local_a8.data);
          }
          else {
            (*(local_a8.allocator)->_vptr_Allocator[3])();
          }
        }
      }
      piVar5 = (int *)CONCAT44(local_f8.refcount._4_4_,local_f8.refcount._0_4_);
      if (piVar5 != (int *)0x0) {
        LOCK();
        *piVar5 = *piVar5 + -1;
        UNLOCK();
        if (*piVar5 == 0) {
          if (local_f8.allocator == (Allocator *)0x0) {
            free(local_f8.data);
          }
          else {
            (*(local_f8.allocator)->_vptr_Allocator[3])();
          }
        }
      }
      if (bVar6) goto LAB_0031a7f2;
      goto LAB_00319f54;
    }
    piVar5 = (int *)CONCAT44(local_f8.refcount._4_4_,local_f8.refcount._0_4_);
    if (piVar5 == (int *)0x0) goto LAB_0031a7f2;
    LOCK();
    *piVar5 = *piVar5 + -1;
    UNLOCK();
    if (*piVar5 != 0) goto LAB_0031a7f2;
    if (local_f8.allocator != (Allocator *)0x0) {
      (*(local_f8.allocator)->_vptr_Allocator[3])();
      goto LAB_0031a7f2;
    }
LAB_0031a3c2:
    free(local_f8.data);
  }
  else {
LAB_00319f54:
    if ((uVar1 == 2) && (iVar13 == 1)) {
      uVar7 = bottom_top_blob->w;
      pvVar14 = bottom_top_blob->data;
      sVar3 = bottom_top_blob->elemsize;
      uVar12 = 0;
      uVar8 = 0;
      if (0 < (int)uVar7) {
        uVar8 = (ulong)uVar7;
      }
      uVar19 = (ulong)(uint)bottom_top_blob->h;
      if (bottom_top_blob->h < 1) {
        uVar19 = uVar12;
      }
      for (; uVar12 != uVar19; uVar12 = uVar12 + 1) {
        fVar23 = -3.4028235e+38;
        for (uVar15 = 0; uVar8 != uVar15; uVar15 = uVar15 + 1) {
          fVar24 = *(float *)((long)pvVar14 + uVar15 * 4);
          if (fVar23 <= fVar24) {
            fVar23 = fVar24;
          }
        }
        fVar24 = 0.0;
        for (uVar15 = 0; uVar8 != uVar15; uVar15 = uVar15 + 1) {
          fVar22 = expf(*(float *)((long)pvVar14 + uVar15 * 4) - fVar23);
          *(float *)((long)pvVar14 + uVar15 * 4) = fVar22;
          fVar24 = fVar24 + fVar22;
        }
        for (uVar15 = 0; uVar8 != uVar15; uVar15 = uVar15 + 1) {
          *(float *)((long)pvVar14 + uVar15 * 4) =
               *(float *)((long)pvVar14 + uVar15 * 4) * (1.0 / fVar24);
        }
        pvVar14 = (void *)((long)pvVar14 + (long)(int)uVar7 * sVar3);
      }
    }
    if ((uVar1 == 3) && (iVar13 == 0)) {
      iVar16 = bottom_top_blob->w;
      _h = bottom_top_blob->h;
      uVar7 = bottom_top_blob->c;
      local_f8.cstep = 0;
      local_f8.data = (void *)0x0;
      local_f8.refcount._0_4_ = 0;
      local_f8.refcount._4_4_ = 0;
      local_f8.elemsize._0_4_ = 0;
      local_f8.elemsize._4_4_ = 0;
      local_f8.elempack = 0;
      local_f8.allocator = (Allocator *)0x0;
      local_f8.dims = 0;
      local_f8.w = 0;
      local_f8.h = 0;
      local_f8.d = 0;
      local_f8.c = 0;
      Mat::create(&local_f8,iVar16,_h,sVar2,opt->workspace_allocator);
      if ((local_f8.data == (void *)0x0) || (local_f8.cstep * (long)local_f8.c == 0)) {
        piVar5 = (int *)CONCAT44(local_f8.refcount._4_4_,local_f8.refcount._0_4_);
        if (piVar5 == (int *)0x0) goto LAB_0031a7f2;
        LOCK();
        *piVar5 = *piVar5 + -1;
        UNLOCK();
        if (*piVar5 != 0) goto LAB_0031a7f2;
        if (local_f8.allocator != (Allocator *)0x0) {
          (*(local_f8.allocator)->_vptr_Allocator[3])();
          goto LAB_0031a7f2;
        }
        goto LAB_0031a3c2;
      }
      uVar10 = (int)local_f8.cstep * local_f8.c;
      uVar8 = 0;
      uVar12 = (ulong)uVar10;
      if ((int)uVar10 < 1) {
        uVar12 = uVar8;
      }
      for (; (int)uVar12 != (int)uVar8; uVar8 = uVar8 + 1) {
        *(undefined4 *)((long)local_f8.data + uVar8 * 4) = 0xff7fffff;
      }
      sVar3 = bottom_top_blob->cstep;
      sVar4 = bottom_top_blob->elemsize;
      uVar8 = 0;
      uVar12 = (ulong)(uint)(_h * iVar16);
      if (_h * iVar16 < 1) {
        uVar12 = uVar8;
      }
      pvVar14 = bottom_top_blob->data;
      uVar19 = (ulong)uVar7;
      if ((int)uVar7 < 1) {
        uVar19 = uVar8;
      }
      for (; uVar8 != uVar19; uVar8 = uVar8 + 1) {
        for (uVar15 = 0; uVar12 != uVar15; uVar15 = uVar15 + 1) {
          fVar23 = *(float *)((long)pvVar14 + uVar15 * 4);
          fVar24 = *(float *)((long)local_f8.data + uVar15 * 4);
          if (fVar23 <= fVar24) {
            fVar23 = fVar24;
          }
          *(float *)((long)local_f8.data + uVar15 * 4) = fVar23;
        }
        pvVar14 = (void *)((long)pvVar14 + sVar3 * sVar4);
      }
      local_a8.cstep = 0;
      local_a8.data = (void *)0x0;
      local_a8.refcount._0_4_ = 0;
      local_a8.refcount._4_4_ = 0;
      local_a8.elemsize._0_4_ = 0;
      local_a8.elemsize._4_4_ = 0;
      local_a8.elempack = 0;
      local_a8.allocator = (Allocator *)0x0;
      local_a8.dims = 0;
      local_a8.w = 0;
      local_a8.h = 0;
      local_a8.d = 0;
      local_a8.c = 0;
      Mat::create(&local_a8,iVar16,_h,sVar2,opt->workspace_allocator);
      bVar6 = true;
      if ((local_a8.data != (void *)0x0) && (local_a8.cstep * (long)local_a8.c != 0)) {
        uVar7 = (int)local_a8.cstep * local_a8.c;
        uVar15 = 0;
        uVar8 = (ulong)uVar7;
        if ((int)uVar7 < 1) {
          uVar8 = uVar15;
        }
        for (; (int)uVar8 != (int)uVar15; uVar15 = uVar15 + 1) {
          *(undefined4 *)((long)local_a8.data + uVar15 * 4) = 0;
        }
        pvVar14 = bottom_top_blob->data;
        sVar3 = bottom_top_blob->cstep;
        sVar4 = bottom_top_blob->elemsize;
        for (uVar8 = 0; pvVar17 = local_a8.data, pvVar20 = local_f8.data, uVar8 != uVar19;
            uVar8 = uVar8 + 1) {
          for (uVar15 = 0; uVar12 != uVar15; uVar15 = uVar15 + 1) {
            fVar23 = expf(*(float *)((long)pvVar14 + uVar15 * 4) -
                          *(float *)((long)pvVar20 + uVar15 * 4));
            *(float *)((long)pvVar14 + uVar15 * 4) = fVar23;
            *(float *)((long)pvVar17 + uVar15 * 4) = fVar23 + *(float *)((long)pvVar17 + uVar15 * 4)
            ;
          }
          pvVar14 = (void *)((long)pvVar14 + sVar3 * sVar4);
        }
        pvVar14 = bottom_top_blob->data;
        sVar3 = bottom_top_blob->cstep;
        sVar4 = bottom_top_blob->elemsize;
        for (uVar8 = 0; uVar8 != uVar19; uVar8 = uVar8 + 1) {
          for (uVar15 = 0; uVar12 != uVar15; uVar15 = uVar15 + 1) {
            *(float *)((long)pvVar14 + uVar15 * 4) =
                 *(float *)((long)pvVar14 + uVar15 * 4) /
                 *(float *)((long)local_a8.data + uVar15 * 4);
          }
          pvVar14 = (void *)((long)pvVar14 + sVar3 * sVar4);
        }
        bVar6 = false;
      }
      piVar5 = (int *)CONCAT44(local_a8.refcount._4_4_,local_a8.refcount._0_4_);
      if (piVar5 != (int *)0x0) {
        LOCK();
        *piVar5 = *piVar5 + -1;
        UNLOCK();
        if (*piVar5 == 0) {
          if (local_a8.allocator == (Allocator *)0x0) {
            free(local_a8.data);
          }
          else {
            (*(local_a8.allocator)->_vptr_Allocator[3])();
          }
        }
      }
      piVar5 = (int *)CONCAT44(local_f8.refcount._4_4_,local_f8.refcount._0_4_);
      if (piVar5 != (int *)0x0) {
        LOCK();
        *piVar5 = *piVar5 + -1;
        UNLOCK();
        if (*piVar5 == 0) {
          if (local_f8.allocator == (Allocator *)0x0) {
            free(local_f8.data);
          }
          else {
            (*(local_f8.allocator)->_vptr_Allocator[3])();
          }
        }
      }
      if (bVar6) goto LAB_0031a7f2;
    }
    if ((uVar1 == 3) && (iVar13 == 1)) {
      uVar7 = bottom_top_blob->w;
      uVar10 = bottom_top_blob->h;
      uVar9 = bottom_top_blob->c;
      local_f8.cstep = 0;
      local_f8.data = (void *)0x0;
      local_f8.refcount._0_4_ = 0;
      local_f8.refcount._4_4_ = 0;
      local_f8.elemsize._0_4_ = 0;
      local_f8.elemsize._4_4_ = 0;
      local_f8.elempack = 0;
      local_f8.allocator = (Allocator *)0x0;
      local_f8.dims = 0;
      local_f8.w = 0;
      local_f8.h = 0;
      local_f8.d = 0;
      local_f8.c = 0;
      Mat::create(&local_f8,uVar7,uVar9,sVar2,opt->workspace_allocator);
      if ((local_f8.data == (void *)0x0) || (local_f8.cstep * (long)local_f8.c == 0)) {
        piVar5 = (int *)CONCAT44(local_f8.refcount._4_4_,local_f8.refcount._0_4_);
        if (piVar5 == (int *)0x0) goto LAB_0031a7f2;
        LOCK();
        *piVar5 = *piVar5 + -1;
        UNLOCK();
        if (*piVar5 != 0) goto LAB_0031a7f2;
        if (local_f8.allocator != (Allocator *)0x0) {
          (*(local_f8.allocator)->_vptr_Allocator[3])();
          goto LAB_0031a7f2;
        }
        goto LAB_0031a3c2;
      }
      uVar11 = (int)local_f8.cstep * local_f8.c;
      uVar8 = 0;
      uVar12 = (ulong)uVar11;
      if ((int)uVar11 < 1) {
        uVar12 = uVar8;
      }
      for (; (int)uVar12 != (int)uVar8; uVar8 = uVar8 + 1) {
        *(undefined4 *)((long)local_f8.data + uVar8 * 4) = 0xff7fffff;
      }
      pvVar14 = bottom_top_blob->data;
      sVar3 = bottom_top_blob->cstep;
      uVar8 = 0;
      uVar12 = 0;
      if (0 < (int)uVar7) {
        uVar12 = (ulong)uVar7;
      }
      uVar19 = (ulong)uVar10;
      if ((int)uVar10 < 1) {
        uVar19 = uVar8;
      }
      uVar15 = 0;
      if (0 < (int)uVar9) {
        uVar15 = (ulong)uVar9;
      }
      sVar4 = bottom_top_blob->elemsize;
      lVar21 = (long)(int)uVar7 * 4;
      pvVar20 = local_f8.data;
      for (; uVar8 != uVar15; uVar8 = uVar8 + 1) {
        pvVar17 = pvVar14;
        for (iVar16 = 0; iVar16 != (int)uVar19; iVar16 = iVar16 + 1) {
          for (uVar18 = 0; uVar12 != uVar18; uVar18 = uVar18 + 1) {
            fVar23 = *(float *)((long)pvVar17 + uVar18 * 4);
            fVar24 = *(float *)((long)pvVar20 + uVar18 * 4);
            if (fVar23 <= fVar24) {
              fVar23 = fVar24;
            }
            *(float *)((long)pvVar20 + uVar18 * 4) = fVar23;
          }
          pvVar17 = (void *)((long)pvVar17 + lVar21);
        }
        pvVar14 = (void *)((long)pvVar14 + sVar3 * sVar4);
        pvVar20 = (void *)((long)pvVar20 +
                          (long)local_f8.w *
                          CONCAT44(local_f8.elemsize._4_4_,(undefined4)local_f8.elemsize));
      }
      local_a8.cstep = 0;
      local_a8.data = (void *)0x0;
      local_a8.refcount._0_4_ = 0;
      local_a8.refcount._4_4_ = 0;
      local_a8.elemsize._0_4_ = 0;
      local_a8.elemsize._4_4_ = 0;
      local_a8.elempack = 0;
      local_a8.allocator = (Allocator *)0x0;
      local_a8.dims = 0;
      local_a8.w = 0;
      local_a8.h = 0;
      local_a8.d = 0;
      local_a8.c = 0;
      Mat::create(&local_a8,uVar7,uVar9,sVar2,opt->workspace_allocator);
      iVar16 = 1;
      if ((local_a8.data != (void *)0x0) && (local_a8.cstep * (long)local_a8.c != 0)) {
        uVar7 = (int)local_a8.cstep * local_a8.c;
        uVar18 = 0;
        uVar8 = (ulong)uVar7;
        if ((int)uVar7 < 1) {
          uVar8 = uVar18;
        }
        for (; (int)uVar8 != (int)uVar18; uVar18 = uVar18 + 1) {
          *(undefined4 *)((long)local_a8.data + uVar18 * 4) = 0;
        }
        local_118 = bottom_top_blob->data;
        sVar2 = bottom_top_blob->cstep;
        local_48 = (long)local_a8.w *
                   CONCAT44(local_a8.elemsize._4_4_,(undefined4)local_a8.elemsize);
        local_40 = (long)local_f8.w *
                   CONCAT44(local_f8.elemsize._4_4_,(undefined4)local_f8.elemsize);
        sVar3 = bottom_top_blob->elemsize;
        local_50 = (void *)CONCAT44(local_50._4_4_,(int)uVar19);
        pvVar14 = local_a8.data;
        pvVar20 = local_f8.data;
        local_38 = uVar15;
        for (uVar8 = 0; uVar8 != local_38; uVar8 = uVar8 + 1) {
          pvVar17 = local_118;
          for (iVar16 = 0; iVar16 != (int)uVar19; iVar16 = iVar16 + 1) {
            for (uVar19 = 0; uVar12 != uVar19; uVar19 = uVar19 + 1) {
              fVar23 = expf(*(float *)((long)pvVar17 + uVar19 * 4) -
                            *(float *)((long)pvVar20 + uVar19 * 4));
              *(float *)((long)pvVar17 + uVar19 * 4) = fVar23;
              *(float *)((long)pvVar14 + uVar19 * 4) =
                   fVar23 + *(float *)((long)pvVar14 + uVar19 * 4);
            }
            pvVar17 = (void *)((long)pvVar17 + lVar21);
            uVar19 = (ulong)local_50 & 0xffffffff;
          }
          pvVar14 = (void *)((long)pvVar14 + local_48);
          pvVar20 = (void *)((long)pvVar20 + local_40);
          local_118 = (void *)((long)local_118 + sVar2 * sVar3);
        }
        pvVar14 = bottom_top_blob->data;
        sVar2 = bottom_top_blob->cstep;
        sVar3 = bottom_top_blob->elemsize;
        pvVar20 = local_a8.data;
        for (uVar8 = 0; iVar16 = 0, pvVar17 = pvVar14, uVar8 != local_38; uVar8 = uVar8 + 1) {
          for (; iVar16 != (int)uVar19; iVar16 = iVar16 + 1) {
            for (uVar15 = 0; uVar12 != uVar15; uVar15 = uVar15 + 1) {
              *(float *)((long)pvVar17 + uVar15 * 4) =
                   *(float *)((long)pvVar17 + uVar15 * 4) / *(float *)((long)pvVar20 + uVar15 * 4);
            }
            pvVar17 = (void *)((long)pvVar17 + lVar21);
          }
          pvVar14 = (void *)((long)pvVar14 + sVar2 * sVar3);
          pvVar20 = (void *)((long)pvVar20 +
                            (long)local_a8.w *
                            CONCAT44(local_a8.elemsize._4_4_,(undefined4)local_a8.elemsize));
        }
      }
      piVar5 = (int *)CONCAT44(local_a8.refcount._4_4_,local_a8.refcount._0_4_);
      if (piVar5 != (int *)0x0) {
        LOCK();
        *piVar5 = *piVar5 + -1;
        UNLOCK();
        if (*piVar5 == 0) {
          if (local_a8.allocator == (Allocator *)0x0) {
            free(local_a8.data);
          }
          else {
            (*(local_a8.allocator)->_vptr_Allocator[3])();
          }
        }
      }
      piVar5 = (int *)CONCAT44(local_f8.refcount._4_4_,local_f8.refcount._0_4_);
      if (piVar5 != (int *)0x0) {
        LOCK();
        *piVar5 = *piVar5 + -1;
        UNLOCK();
        if (*piVar5 == 0) {
          if (local_f8.allocator == (Allocator *)0x0) {
            free(local_f8.data);
          }
          else {
            (*(local_f8.allocator)->_vptr_Allocator[3])();
          }
        }
      }
      if ((char)iVar16 != '\0') goto LAB_0031a7f2;
    }
    local_58 = 0;
    if ((uVar1 == 3) && (iVar13 == 2)) {
      uVar1 = bottom_top_blob->w;
      iVar13 = bottom_top_blob->h;
      pvVar14 = bottom_top_blob->data;
      sVar2 = bottom_top_blob->cstep;
      uVar12 = 0;
      if (0 < (int)uVar1) {
        uVar12 = (ulong)uVar1;
      }
      if (iVar13 < 1) {
        iVar13 = 0;
      }
      local_58 = 0;
      uVar8 = (ulong)(uint)bottom_top_blob->c;
      if (bottom_top_blob->c < 1) {
        uVar8 = 0;
      }
      sVar3 = bottom_top_blob->elemsize;
      for (uVar19 = 0; uVar19 != uVar8; uVar19 = uVar19 + 1) {
        local_50 = pvVar14;
        for (iVar16 = 0; iVar16 != iVar13; iVar16 = iVar16 + 1) {
          fVar23 = -3.4028235e+38;
          for (uVar15 = 0; uVar12 != uVar15; uVar15 = uVar15 + 1) {
            fVar24 = *(float *)((long)pvVar14 + uVar15 * 4);
            if (fVar23 <= fVar24) {
              fVar23 = fVar24;
            }
          }
          fVar24 = 0.0;
          for (uVar15 = 0; uVar12 != uVar15; uVar15 = uVar15 + 1) {
            fVar22 = expf(*(float *)((long)pvVar14 + uVar15 * 4) - fVar23);
            *(float *)((long)pvVar14 + uVar15 * 4) = fVar22;
            fVar24 = fVar24 + fVar22;
          }
          for (uVar15 = 0; uVar12 != uVar15; uVar15 = uVar15 + 1) {
            *(float *)((long)pvVar14 + uVar15 * 4) =
                 *(float *)((long)pvVar14 + uVar15 * 4) * (1.0 / fVar24);
          }
          pvVar14 = (void *)((long)pvVar14 + (long)(int)uVar1 * 4);
        }
        pvVar14 = (void *)((long)local_50 + sVar2 * sVar3);
      }
    }
  }
LAB_0031a7f2:
  return (int)local_58;
}

Assistant:

int Softmax::forward_inplace(Mat& bottom_top_blob, const Option& opt) const
{
    // value = expf( value - global max value )
    // sum all value
    // value = value / sum

    int dims = bottom_top_blob.dims;
    size_t elemsize = bottom_top_blob.elemsize;
    int positive_axis = axis < 0 ? dims + axis : axis;

    if (dims == 1) // positive_axis == 0
    {
        int w = bottom_top_blob.w;

        float* ptr = bottom_top_blob;

        float max = -FLT_MAX;
        for (int i = 0; i < w; i++)
        {
            max = std::max(max, ptr[i]);
        }

        float sum = 0.f;
        for (int i = 0; i < w; i++)
        {
            ptr[i] = expf(ptr[i] - max);
            sum += ptr[i];
        }

        for (int i = 0; i < w; i++)
        {
            ptr[i] /= sum;
        }
    }

    if (dims == 2 && positive_axis == 0)
    {
        int w = bottom_top_blob.w;
        int h = bottom_top_blob.h;

        Mat max;
        max.create(w, elemsize, opt.workspace_allocator);
        if (max.empty())
            return -100;
        max.fill(-FLT_MAX);

        for (int i = 0; i < h; i++)
        {
            const float* ptr = bottom_top_blob.row(i);
            for (int j = 0; j < w; j++)
            {
                max[j] = std::max(max[j], ptr[j]);
            }
        }

        Mat sum;
        sum.create(w, elemsize, opt.workspace_allocator);
        if (sum.empty())
            return -100;
        sum.fill(0.f);

        for (int i = 0; i < h; i++)
        {
            float* ptr = bottom_top_blob.row(i);
            for (int j = 0; j < w; j++)
            {
                ptr[j] = expf(ptr[j] - max[j]);
                sum[j] += ptr[j];
            }
        }

        for (int i = 0; i < h; i++)
        {
            float* ptr = bottom_top_blob.row(i);
            for (int j = 0; j < w; j++)
            {
                ptr[j] /= sum[j];
            }
        }
    }

    if (dims == 2 && positive_axis == 1)
    {
        int w = bottom_top_blob.w;
        int h = bottom_top_blob.h;

        for (int i = 0; i < h; i++)
        {
            float* ptr = bottom_top_blob.row(i);
            float m = -FLT_MAX;
            for (int j = 0; j < w; j++)
            {
                m = std::max(m, ptr[j]);
            }

            float s = 0.f;
            for (int j = 0; j < w; j++)
            {
                ptr[j] = expf(ptr[j] - m);
                s += ptr[j];
            }

            for (int j = 0; j < w; j++)
            {
                ptr[j] /= s;
            }
        }
    }

    if (dims == 3 && positive_axis == 0)
    {
        int w = bottom_top_blob.w;
        int h = bottom_top_blob.h;
        int channels = bottom_top_blob.c;
        int size = w * h;

        Mat max;
        max.create(w, h, elemsize, opt.workspace_allocator);
        if (max.empty())
            return -100;
        max.fill(-FLT_MAX);
        for (int q = 0; q < channels; q++)
        {
            const float* ptr = bottom_top_blob.channel(q);

            for (int i = 0; i < size; i++)
            {
                max[i] = std::max(max[i], ptr[i]);
            }
        }

        Mat sum;
        sum.create(w, h, elemsize, opt.workspace_allocator);
        if (sum.empty())
            return -100;
        sum.fill(0.f);
        for (int q = 0; q < channels; q++)
        {
            float* ptr = bottom_top_blob.channel(q);

            for (int i = 0; i < size; i++)
            {
                ptr[i] = expf(ptr[i] - max[i]);
                sum[i] += ptr[i];
            }
        }

        #pragma omp parallel for num_threads(opt.num_threads)
        for (int q = 0; q < channels; q++)
        {
            float* ptr = bottom_top_blob.channel(q);

            for (int i = 0; i < size; i++)
            {
                ptr[i] /= sum[i];
            }
        }
    }

    if (dims == 3 && positive_axis == 1)
    {
        int w = bottom_top_blob.w;
        int h = bottom_top_blob.h;
        int channels = bottom_top_blob.c;

        Mat max;
        max.create(w, channels, elemsize, opt.workspace_allocator);
        if (max.empty())
            return -100;
        max.fill(-FLT_MAX);
        #pragma omp parallel for num_threads(opt.num_threads)
        for (int q = 0; q < channels; q++)
        {
            const float* ptr = bottom_top_blob.channel(q);
            float* maxptr = max.row(q);

            for (int i = 0; i < h; i++)
            {
                for (int j = 0; j < w; j++)
                {
                    maxptr[j] = std::max(maxptr[j], ptr[j]);
                }

                ptr += w;
            }
        }

        Mat sum;
        sum.create(w, channels, elemsize, opt.workspace_allocator);
        if (sum.empty())
            return -100;
        sum.fill(0.f);
        #pragma omp parallel for num_threads(opt.num_threads)
        for (int q = 0; q < channels; q++)
        {
            float* ptr = bottom_top_blob.channel(q);
            float* maxptr = max.row(q);
            float* sumptr = sum.row(q);

            for (int i = 0; i < h; i++)
            {
                for (int j = 0; j < w; j++)
                {
                    ptr[j] = expf(ptr[j] - maxptr[j]);
                    sumptr[j] += ptr[j];
                }

                ptr += w;
            }
        }

        #pragma omp parallel for num_threads(opt.num_threads)
        for (int q = 0; q < channels; q++)
        {
            float* ptr = bottom_top_blob.channel(q);
            float* sumptr = sum.row(q);

            for (int i = 0; i < h; i++)
            {
                for (int j = 0; j < w; j++)
                {
                    ptr[j] /= sumptr[j];
                }

                ptr += w;
            }
        }
    }

    if (dims == 3 && positive_axis == 2)
    {
        int w = bottom_top_blob.w;
        int h = bottom_top_blob.h;
        int channels = bottom_top_blob.c;

        #pragma omp parallel for num_threads(opt.num_threads)
        for (int q = 0; q < channels; q++)
        {
            float* ptr = bottom_top_blob.channel(q);

            for (int i = 0; i < h; i++)
            {
                float max = -FLT_MAX;
                for (int j = 0; j < w; j++)
                {
                    max = std::max(max, ptr[j]);
                }

                float sum = 0.f;
                for (int j = 0; j < w; j++)
                {
                    ptr[j] = expf(ptr[j] - max);
                    sum += ptr[j];
                }

                for (int j = 0; j < w; j++)
                {
                    ptr[j] /= sum;
                }

                ptr += w;
            }
        }
    }

    return 0;
}